

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_slopes.cpp
# Opt level: O0

void P_SetSlopes(void)

{
  uint local_14;
  int local_10;
  int bits;
  int s;
  int i;
  
  for (bits = 0; bits < numlines; bits = bits + 1) {
    if ((lines[bits].special == 0xb5) &&
       (lines[bits].special = 0, lines[bits].backsector != (sector_t_conflict *)0x0)) {
      for (local_10 = 0; local_10 < 2; local_10 = local_10 + 1) {
        local_14 = lines[bits].args[local_10] & 3;
        if ((local_10 == 1) && (local_14 == 0)) {
          local_14 = lines[bits].args[0] >> 2 & 3;
        }
        if (local_14 == 1) {
          P_AlignPlane(lines[bits].frontsector,lines + bits,local_10);
        }
        else if (local_14 == 2) {
          P_AlignPlane(lines[bits].backsector,lines + bits,local_10);
        }
      }
    }
  }
  return;
}

Assistant:

void P_SetSlopes ()
{
	int i, s;

	for (i = 0; i < numlines; i++)
	{
		if (lines[i].special == Plane_Align)
		{
			lines[i].special = 0;
			if (lines[i].backsector != NULL)
			{
				// args[0] is for floor, args[1] is for ceiling
				//
				// As a special case, if args[1] is 0,
				// then args[0], bits 2-3 are for ceiling.
				for (s = 0; s < 2; s++)
				{
					int bits = lines[i].args[s] & 3;

					if (s == 1 && bits == 0)
						bits = (lines[i].args[0] >> 2) & 3;

					if (bits == 1)			// align front side to back
						P_AlignPlane (lines[i].frontsector, lines + i, s);
					else if (bits == 2)		// align back side to front
						P_AlignPlane (lines[i].backsector, lines + i, s);
				}
			}
		}
	}
}